

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

int __thiscall google::protobuf::DescriptorProto::ByteSize(DescriptorProto *this)

{
  byte bVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Type *pTVar6;
  Type *value;
  Type *value_00;
  Type *value_01;
  int i;
  int iVar7;
  MessageOptions *value_02;
  
  bVar1 = (byte)this->_has_bits_[0];
  uVar3 = (uint)bVar1;
  iVar7 = 0;
  iVar4 = 0;
  if (bVar1 != 0) {
    iVar4 = 0;
    if ((bVar1 & 1) != 0) {
      iVar4 = internal::WireFormatLite::StringSize(this->name_);
      iVar4 = iVar4 + 1;
      uVar3 = this->_has_bits_[0];
    }
    if ((uVar3 & 0x40) != 0) {
      value_02 = this->options_;
      if (value_02 == (MessageOptions *)0x0) {
        value_02 = *(MessageOptions **)(default_instance_ + 0x90);
      }
      iVar5 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::MessageOptions>
                        (value_02);
      iVar4 = iVar4 + iVar5 + 1;
    }
  }
  iVar5 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar5;
  for (; iVar7 < iVar5; iVar7 = iVar7 + 1) {
    pTVar6 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(this->field_).super_RepeatedPtrFieldBase,iVar7);
    iVar5 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::FieldDescriptorProto>
                      (pTVar6);
    iVar4 = iVar4 + iVar5;
    iVar5 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
  }
  iVar7 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar7;
  for (iVar5 = 0; iVar5 < iVar7; iVar5 = iVar5 + 1) {
    pTVar6 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(this->extension_).super_RepeatedPtrFieldBase,iVar5);
    iVar7 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::FieldDescriptorProto>
                      (pTVar6);
    iVar4 = iVar4 + iVar7;
    iVar7 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  }
  iVar7 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar7;
  for (iVar5 = 0; iVar5 < iVar7; iVar5 = iVar5 + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                      (&(this->nested_type_).super_RepeatedPtrFieldBase,iVar5);
    iVar7 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::DescriptorProto>(value)
    ;
    iVar4 = iVar4 + iVar7;
    iVar7 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  }
  iVar7 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar7;
  for (iVar5 = 0; iVar5 < iVar7; iVar5 = iVar5 + 1) {
    value_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar5);
    iVar7 = internal::WireFormatLite::MessageSizeNoVirtual<google::protobuf::EnumDescriptorProto>
                      (value_00);
    iVar4 = iVar4 + iVar7;
    iVar7 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  }
  iVar7 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar7;
  for (iVar5 = 0; iVar5 < iVar7; iVar5 = iVar5 + 1) {
    value_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                         (&(this->extension_range_).super_RepeatedPtrFieldBase,iVar5);
    iVar7 = internal::WireFormatLite::
            MessageSizeNoVirtual<google::protobuf::DescriptorProto_ExtensionRange>(value_01);
    iVar4 = iVar4 + iVar7;
    iVar7 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  }
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar7 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar4 = iVar7 + iVar4;
  }
  this->_cached_size_ = iVar4;
  return iVar4;
}

Assistant:

int DescriptorProto::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string name = 1;
    if (has_name()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->name());
    }

    // optional .google.protobuf.MessageOptions options = 7;
    if (has_options()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->options());
    }

  }
  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  total_size += 1 * this->field_size();
  for (int i = 0; i < this->field_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->field(i));
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  total_size += 1 * this->extension_size();
  for (int i = 0; i < this->extension_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->extension(i));
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  total_size += 1 * this->nested_type_size();
  for (int i = 0; i < this->nested_type_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->nested_type(i));
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  total_size += 1 * this->enum_type_size();
  for (int i = 0; i < this->enum_type_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->enum_type(i));
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  total_size += 1 * this->extension_range_size();
  for (int i = 0; i < this->extension_range_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->extension_range(i));
  }

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}